

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscroller.cpp
# Opt level: O1

qreal differentialForProgress(QEasingCurve *curve,qreal pos)

{
  QDebug QVar1;
  uint uVar2;
  long in_FS_OFFSET;
  double dVar3;
  double dVar4;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QDebug local_50;
  QDebug local_48;
  QDebug local_40;
  QArrayData *local_38 [3];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  dVar3 = (double)QEasingCurve::valueForProgress
                            ((double)(-(ulong)(0.5 <= pos) & (ulong)pos |
                                     ~-(ulong)(0.5 <= pos) & (ulong)(pos + 0.01)));
  dVar4 = (double)QEasingCurve::valueForProgress
                            ((double)(~-(ulong)(pos < 0.5) & (ulong)(pos + -0.01) |
                                     -(ulong)(pos < 0.5) & (ulong)pos));
  dVar3 = (dVar3 - dVar4) / 0.01;
  lcScroller();
  if (((byte)lcScroller::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    QMessageLogger::debug();
    QVar1.stream = local_50.stream;
    QVar5.m_data = (storage_type *)0x1e;
    QVar5.m_size = (qsizetype)local_38;
    QString::fromUtf8(QVar5);
    QTextStream::operator<<((QTextStream *)QVar1.stream,(QString *)local_38);
    if (local_38[0] != (QArrayData *)0x0) {
      LOCK();
      (local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_38[0],2,0x10);
      }
    }
    if (*(QTextStream *)(local_50.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_50.stream,' ');
    }
    local_48.stream = local_50.stream;
    *(int *)(local_50.stream + 0x28) = *(int *)(local_50.stream + 0x28) + 1;
    uVar2 = QEasingCurve::type();
    qt_QMetaEnum_debugOperator
              (&local_40,(longlong)&local_48,(QMetaObject *)(ulong)uVar2,
               (char *)&QEasingCurve::staticMetaObject);
    QVar1.stream = local_40.stream;
    QVar6.m_data = (storage_type *)0x7;
    QVar6.m_size = (qsizetype)local_38;
    QString::fromUtf8(QVar6);
    QTextStream::operator<<((QTextStream *)QVar1.stream,(QString *)local_38);
    if (local_38[0] != (QArrayData *)0x0) {
      LOCK();
      (local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_38[0],2,0x10);
      }
    }
    if (*(QTextStream *)(local_40.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_40.stream,' ');
    }
    QTextStream::operator<<((QTextStream *)local_40.stream,pos);
    if (*(QTextStream *)(local_40.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_40.stream,' ');
    }
    QVar1.stream = local_40.stream;
    QVar7.m_data = (storage_type *)0x4;
    QVar7.m_size = (qsizetype)local_38;
    QString::fromUtf8(QVar7);
    QTextStream::operator<<((QTextStream *)QVar1.stream,(QString *)local_38);
    if (local_38[0] != (QArrayData *)0x0) {
      LOCK();
      (local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_38[0],2,0x10);
      }
    }
    if (*(QTextStream *)(local_40.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_40.stream,' ');
    }
    QTextStream::operator<<((QTextStream *)local_40.stream,dVar3);
    if (*(QTextStream *)(local_40.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_40.stream,' ');
    }
    QDebug::~QDebug(&local_40);
    QDebug::~QDebug(&local_48);
    QDebug::~QDebug(&local_50);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return dVar3;
  }
  __stack_chk_fail();
}

Assistant:

static qreal differentialForProgress(const QEasingCurve &curve, qreal pos)
{
    const qreal dx = 0.01;
    qreal left = (pos < qreal(0.5)) ? pos : pos - qreal(dx);
    qreal right = (pos >= qreal(0.5)) ? pos : pos + qreal(dx);
    qreal d = (curve.valueForProgress(right) - curve.valueForProgress(left)) / qreal(dx);

    qCDebug(lcScroller) << "differentialForProgress(type: " << curve.type()
                        << ", pos: " << pos << ") = " << d;

    return d;
}